

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lyds_tree.c
# Opt level: O3

void lyplg_type_free_lyds(ly_ctx *UNUSED_ctx,lyd_value *value)

{
  if (value->_canonical == (char *)0x0) {
    lyds_free_tree((rb_node *)(value->field_2).enum_item);
    (value->field_2).dec64 = 0;
    *(undefined8 *)((long)&value->field_2 + 8) = 0;
    *(undefined8 *)((long)&value->field_2 + 0x10) = 0;
    return;
  }
  __assert_fail("!value->_canonical",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/lyds_tree.c"
                ,0x49,"void lyplg_type_free_lyds(const struct ly_ctx *, struct lyd_value *)");
}

Assistant:

static void
lyplg_type_free_lyds(const struct ly_ctx *UNUSED(ctx), struct lyd_value *value)
{
    struct lyd_value_lyds_tree *val = NULL;

    /* The canonical value is not used at all. */
    assert(!value->_canonical);
    LYD_VALUE_GET(value, val);

    /* Release Red-black tree. */
    lyds_free_tree(val->rbt);
    LYPLG_TYPE_VAL_INLINE_DESTROY(val);
    memset(value->fixed_mem, 0, LYD_VALUE_FIXED_MEM_SIZE);
}